

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

int __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
::GetCachedSize(MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3,_0>
                *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  undefined4 extraout_var_00;
  ulong uVar6;
  
  uVar3 = this->_has_bits_[0];
  iVar4 = 0;
  iVar2 = 0;
  if ((uVar3 & 1) != 0) {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
    sVar5 = WireFormatLite::StringSize((string *)CONCAT44(extraout_var,iVar2));
    iVar2 = (int)sVar5 + 1;
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 2) != 0) {
    iVar4 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
    uVar6 = *(ulong *)CONCAT44(extraout_var_00,iVar4) | 1;
    lVar1 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar4 = ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  return iVar4 + iVar2;
}

Assistant:

int GetCachedSize() const {
    int size = 0;
    size += has_key()
        ? kTagSize + KeyTypeHandler::GetCachedSize(key())
        : 0;
    size += has_value()
        ? kTagSize + ValueTypeHandler::GetCachedSize(
            value())
        : 0;
    return size;
  }